

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O2

Expected<const_llvm::DWARFDebugLine::LineTable_*> __thiscall
llvm::DWARFDebugLine::getOrParseLineTable
          (DWARFDebugLine *this,DWARFDataExtractor *DebugLineData,uint64_t Offset,DWARFContext *Ctx,
          DWARFUnit *U,function<void_(llvm::Error)> *RecoverableErrorCallback)

{
  char *Fmt;
  undefined8 extraout_RDX;
  undefined8 uVar1;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  _Base_ptr *DebugLineData_00;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_llvm::DWARFDebugLine::LineTable>_>,_bool>
  pVar2;
  Expected<const_llvm::DWARFDebugLine::LineTable_*> EVar3;
  error_code EC;
  function<void_(llvm::Error)> *in_stack_00000008;
  undefined1 local_1d0 [8];
  LineTable *LT;
  ErrorInfoBase *local_120 [21];
  undefined1 local_78 [40];
  DWARFUnit *local_50;
  Error local_48;
  Error local_40;
  undefined1 local_38 [8];
  uint64_t Offset_local;
  
  local_38 = (undefined1  [8])Ctx;
  if (Ctx < *(DWARFContext **)(Offset + 8)) {
    local_78._32_8_ = RecoverableErrorCallback;
    local_50 = U;
    LineTable::LineTable((LineTable *)local_120);
    local_1d0 = local_38;
    LineTable::LineTable((LineTable *)&LT,(LineTable *)local_120);
    pVar2 = std::
            _Rb_tree<unsigned_long,std::pair<unsigned_long_const,llvm::DWARFDebugLine::LineTable>,std::_Select1st<std::pair<unsigned_long_const,llvm::DWARFDebugLine::LineTable>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,llvm::DWARFDebugLine::LineTable>>>
            ::_M_insert_unique<std::pair<unsigned_long_const,llvm::DWARFDebugLine::LineTable>>
                      ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,llvm::DWARFDebugLine::LineTable>,std::_Select1st<std::pair<unsigned_long_const,llvm::DWARFDebugLine::LineTable>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,llvm::DWARFDebugLine::LineTable>>>
                        *)DebugLineData,
                       (pair<const_unsigned_long,_llvm::DWARFDebugLine::LineTable> *)local_1d0);
    LineTable::~LineTable((LineTable *)&LT);
    LineTable::~LineTable((LineTable *)local_120);
    DebugLineData_00 = &pVar2.first._M_node._M_node[1]._M_parent;
    local_1d0 = (undefined1  [8])DebugLineData_00;
    if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      std::function<void_(llvm::Error)>::function
                ((function<void_(llvm::Error)> *)local_78,in_stack_00000008);
      LineTable::parse((LineTable *)local_120,(DWARFDataExtractor *)DebugLineData_00,
                       (uint64_t *)Offset,(DWARFContext *)local_38,local_50,
                       (function<void_(llvm::Error)> *)local_78._32_8_,(raw_ostream *)local_78);
      std::_Function_base::~_Function_base((_Function_base *)local_78);
      if ((ErrorInfoBase *)0x1 < local_120[0]) {
        local_40.Payload = (ErrorInfoBase *)((ulong)local_120[0] | 1);
        local_120[0] = (ErrorInfoBase *)0x0;
        Expected<const_llvm::DWARFDebugLine::LineTable_*>::Expected
                  ((Expected<const_llvm::DWARFDebugLine::LineTable_*> *)this,&local_40);
        uVar1 = extraout_RDX_02;
        local_48.Payload = local_120[0];
        if ((long *)((ulong)local_40.Payload & 0xfffffffffffffffe) != (long *)0x0) {
          (**(code **)(*(long *)((ulong)local_40.Payload & 0xfffffffffffffffe) + 8))();
          uVar1 = extraout_RDX_03;
          local_48.Payload = local_120[0];
        }
        goto LAB_00d8dcab;
      }
    }
    Expected<llvm::DWARFDebugLine::LineTable_const*>::Expected<llvm::DWARFDebugLine::LineTable*>
              ((Expected<llvm::DWARFDebugLine::LineTable_const*> *)this,(LineTable **)local_1d0,
               (type *)0x0);
    uVar1 = extraout_RDX_01;
  }
  else {
    Fmt = (char *)std::_V2::generic_category();
    EC._M_cat = (error_category *)0x16;
    EC._0_8_ = &local_48;
    createStringError<unsigned_long>
              (EC,Fmt,(unsigned_long *)"offset 0x%8.8lx is not a valid debug line section offset");
    Expected<const_llvm::DWARFDebugLine::LineTable_*>::Expected
              ((Expected<const_llvm::DWARFDebugLine::LineTable_*> *)this,&local_48);
    uVar1 = extraout_RDX;
LAB_00d8dcab:
    if ((long *)((ulong)local_48.Payload & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)((ulong)local_48.Payload & 0xfffffffffffffffe) + 8))();
      uVar1 = extraout_RDX_00;
    }
  }
  EVar3._8_8_ = uVar1;
  EVar3.field_0 =
       (anon_union_8_2_427f0595_for_Expected<const_llvm::DWARFDebugLine::LineTable_*>_2)this;
  return EVar3;
}

Assistant:

Expected<const DWARFDebugLine::LineTable *> DWARFDebugLine::getOrParseLineTable(
    DWARFDataExtractor &DebugLineData, uint64_t Offset, const DWARFContext &Ctx,
    const DWARFUnit *U, std::function<void(Error)> RecoverableErrorCallback) {
  if (!DebugLineData.isValidOffset(Offset))
    return createStringError(errc::invalid_argument, "offset 0x%8.8" PRIx64
                       " is not a valid debug line section offset",
                       Offset);

  std::pair<LineTableIter, bool> Pos =
      LineTableMap.insert(LineTableMapTy::value_type(Offset, LineTable()));
  LineTable *LT = &Pos.first->second;
  if (Pos.second) {
    if (Error Err =
            LT->parse(DebugLineData, &Offset, Ctx, U, RecoverableErrorCallback))
      return std::move(Err);
    return LT;
  }
  return LT;
}